

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

void __thiscall
optimization::common_expr_del::BlockNodes::add_var(BlockNodes *this,VarId *var,NodeId nodeId)

{
  element_type *peVar1;
  bool bVar2;
  mapped_type *pmVar3;
  value_type *__x;
  long lStack_60;
  value_type local_50;
  value_type local_40;
  VarId local_30;
  
  pmVar3 = std::
           map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
           ::operator[](&this->var_map,var);
  pmVar3->id = nodeId.id;
  local_30.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_30.id = var->id;
  bVar2 = in_live_out(this,&local_30);
  peVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start[nodeId.id].
           super___shared_ptr<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (bVar2) {
    __x = &local_40;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    lStack_60 = 0x48;
  }
  else {
    __x = &local_50;
    local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    lStack_60 = 0x60;
  }
  __x->id = var->id;
  std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
            ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             ((long)&peVar1->operands + lStack_60),__x);
  return;
}

Assistant:

void add_var(mir::inst::VarId var, NodeId nodeId) {
    var_map[var] = nodeId;
    if (in_live_out(var)) {
      nodes[nodeId.id]->add_live_var(var);
    } else {
      nodes[nodeId.id]->add_local_var(var);
    }
  }